

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O3

string * __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::DoCheckSol_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ArrayRef<double> *x,ValueMapDbl *duals,
          ArrayRef<double> *obj,ArrayRef<double> *x_raw,
          vector<double,_std::allocator<double>_> *x_back,bool if_recomp_vals)

{
  uint uVar1;
  ArrayRef<double> lb;
  ArrayRef<double> ub;
  void *pvVar2;
  long lVar3;
  int in_stack_fffffffffffffc80;
  void *pvVar4;
  ArrayRef<mp::var::Type> local_348;
  ArrayRef<double> local_318;
  ArrayRef<double> local_2e8;
  ArrayRef<double> local_2b8;
  SolCheck chk;
  
  local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.data_ = x->data_;
  local_2b8.size_ = x->size_;
  local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.data_ = obj->data_;
  local_2e8.size_ = obj->size_;
  local_318.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.data_ = x_raw->data_;
  local_318.size_ = x_raw->size_;
  local_348.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_348.data_ = *(Type **)((long)this + -0x1b0);
  local_348.size_ = *(long *)((long)this + -0x1a8) - (long)local_348.data_ >> 2;
  pvVar4 = (void *)0x0;
  pvVar2 = (void *)0x0;
  lVar3 = 0;
  uVar1 = (int)*(uint *)((long)this + 0xe0) >> 5;
  if (!if_recomp_vals) {
    uVar1 = *(uint *)((long)this + 0xe0);
  }
  lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&stack0xfffffffffffffc58;
  lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&stack0xfffffffffffffc88;
  lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = *(undefined4 *)((long)this + 0x100);
  lb.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  lb.data_._0_4_ = *(undefined4 *)((long)this + 0x104);
  lb.data_._4_4_ = 0;
  lb.size_._0_1_ = if_recomp_vals;
  lb.size_._1_7_ = 0;
  ub.size_ = *(size_t *)((long)this + -0x1f8);
  ub.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data =
       (_Vector_base<double,_std::allocator<double>_>)
       (_Vector_base<double,_std::allocator<double>_>)SUB3224(ZEXT432(uVar1),0);
  ub.data_ = (double *)SUB328(ZEXT432(uVar1),0x18);
  SolCheck::SolCheck(&chk,&local_2b8,duals,&local_2e8,&local_318,&local_348,lb,ub,
                     *(double *)((long)this + 0xe8),*(double *)((long)this + 0xf0),
                     (int)((long)(*(long *)((long)this + -0x1f0) - *(size_t *)((long)this + -0x1f8))
                          >> 3),in_stack_fffffffffffffc80,false,0);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,lVar3 - (long)pvVar2);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,-(long)pvVar4);
  }
  if (local_348.save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.save_.
                    super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_318.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_318.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.save_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((chk.check_mode_ & 1U) != 0) {
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::CheckVars((SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,&chk);
  }
  if ((chk.check_mode_ & 0xeU) != 0) {
    ConstraintManager::ComputeViolations((ConstraintManager *)((long)this + -0x248),&chk);
  }
  if ((chk.check_mode_ & 0x10U) != 0) {
    SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::CheckObjs((SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)this,&chk);
  }
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GenerateViolationsReport
            ((SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&chk,if_recomp_vals);
  std::vector<double,_std::allocator<double>_>::operator=(x_back,&chk.x_.x_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,chk.report_._M_dataplus._M_p,
             chk.report_._M_dataplus._M_p + chk.report_._M_string_length);
  SolCheck::~SolCheck(&chk);
  return __return_storage_ptr__;
}

Assistant:

std::string DoCheckSol(
      ArrayRef<double> x,
      const pre::ValueMapDbl& duals,
      ArrayRef<double> obj,
      ArrayRef<double> x_raw,
      std::vector<double>& x_back,
      bool if_recomp_vals) {
    SolCheck chk(x, duals, obj, x_raw,
                 MPCD( GetModel() ).var_type_vec(),
                 MPCD( GetModel() ).var_lb_vec(),
                 MPCD( GetModel() ).var_ub_vec(),
                 MPCD( sol_feas_tol() ),
                 MPCD( sol_feas_tol_rel() ),
                 MPCD( sol_round() ),
                 MPCD( sol_prec() ),
                 if_recomp_vals,
                 if_recomp_vals
                 ? (MPCD( sol_check_mode() ) >> 5)
                 : (MPCD( sol_check_mode() )));  // for raw values
    if (chk.check_mode() & 1)
      CheckVars(chk);
    if (chk.check_mode() & (2+4+8))
      CheckCons(chk);
    if (chk.check_mode() & 16)
      CheckObjs(chk);
    MPD( GenerateViolationsReport(chk, if_recomp_vals) );
    x_back = std::move(chk.x_ext().get_x()); // to reuse 'realistic' vector
    return chk.GetReport();
  }